

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O3

char * __cxxabiv1::anon_unknown_0::parse_prefix_expression<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,String *op,Db *db)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *pbVar2;
  char *pcVar3;
  undefined8 uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar5;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  __str;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_90;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_70;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_50;
  
  pcVar3 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>(first,last,db);
  if (pcVar3 == first) {
    return first;
  }
  if ((db->names).
      super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (db->names).
      super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return first;
  }
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  ::basic_string(&local_70,op);
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  ::append(&local_70,"(");
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  ::move_full(&local_90,
              (db->names).
              super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1);
  paVar1 = &local_70.field_2;
  uVar4 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    uVar4 = local_70.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar4 < local_90._M_string_length + local_70._M_string_length) {
    paVar5 = &local_90.field_2;
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_90._M_dataplus._M_p != paVar5) {
      uVar4 = local_90.field_2._M_allocated_capacity;
    }
    if (local_90._M_string_length + local_70._M_string_length <= (ulong)uVar4) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::replace(&local_90,0,0,local_70._M_dataplus._M_p,local_70._M_string_length);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_90._M_dataplus._M_p == paVar5) {
        local_b0.field_2._8_8_ = local_90.field_2._8_8_;
      }
      else {
        local_b0._M_dataplus._M_p = local_90._M_dataplus._M_p;
      }
      local_b0.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
      pbVar2 = &local_90;
      local_b0._M_string_length = local_90._M_string_length;
      local_90._M_dataplus._M_p = (pointer)paVar5;
      goto LAB_001ab86a;
    }
  }
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  ::_M_append(&local_70,local_90._M_dataplus._M_p,local_90._M_string_length);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_70._M_dataplus._M_p == paVar1) {
    local_b0.field_2._8_8_ = local_70.field_2._8_8_;
  }
  else {
    local_b0._M_dataplus._M_p = local_70._M_dataplus._M_p;
  }
  local_b0.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
  pbVar2 = &local_70;
  local_b0._M_string_length = local_70._M_string_length;
  paVar5 = paVar1;
  local_70._M_dataplus._M_p = (pointer)paVar1;
LAB_001ab86a:
  pbVar2->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  ::append(&local_b0,")");
  paVar5 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar5) {
    local_50.field_2._8_8_ = local_b0.field_2._8_8_;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50._M_dataplus._M_p = local_b0._M_dataplus._M_p;
  }
  local_50._M_string_length = local_b0._M_string_length;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_allocated_capacity =
       local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_b0._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  ::operator=(&(db->names).
               super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].first,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    free(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar5) {
    free(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    free(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    free(local_70._M_dataplus._M_p);
  }
  return pcVar3;
}

Assistant:

const char*
parse_prefix_expression(const char* first, const char* last, const typename C::String& op, C& db)
{
    const char* t1 = parse_expression(first, last, db);
    if (t1 != first)
    {
        if (db.names.empty())
            return first;
        db.names.back().first =  op + "(" + db.names.back().move_full() + ")";
        first = t1;
    }
    return first;
}